

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

void __thiscall wasm::Vacuum::~Vacuum(Vacuum *this)

{
  Vacuum *this_local;
  
  ~Vacuum(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override { return std::make_unique<Vacuum>(); }